

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O1

bool bssl::ssl_needs_record_splitting(SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  
  if (((((ssl->s3->aead_write_ctx)._M_t.
         super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ !=
        (SSL_CIPHER *)0x0) && (uVar1 = ssl_protocol_version(ssl), uVar1 < 0x302)) &&
     ((ssl->mode & 0x100) != 0)) {
    iVar2 = SSL_CIPHER_is_block_cipher
                      (((ssl->s3->aead_write_ctx)._M_t.
                        super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_)
    ;
    return iVar2 != 0;
  }
  return false;
}

Assistant:

bool ssl_needs_record_splitting(const SSL *ssl) {
  return !CRYPTO_fuzzer_mode_enabled() &&
         !ssl->s3->aead_write_ctx->is_null_cipher() &&
         ssl_protocol_version(ssl) < TLS1_1_VERSION &&
         (ssl->mode & SSL_MODE_CBC_RECORD_SPLITTING) != 0 &&
         SSL_CIPHER_is_block_cipher(ssl->s3->aead_write_ctx->cipher());
}